

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

item<mpt::layout::graph> * __thiscall
mpt::item_array<mpt::layout::graph>::append
          (item_array<mpt::layout::graph> *this,graph *t,char *id,int len)

{
  content<mpt::item<mpt::layout::graph>_> *pcVar1;
  graph *pgVar2;
  bool bVar3;
  item<mpt::layout::graph> *piVar4;
  ulong pos;
  
  pcVar1 = (this->super_unique_array<mpt::item<mpt::layout::graph>_>)._ref._ref;
  if (pcVar1 == (content<mpt::item<mpt::layout::graph>_> *)0x0) {
    pos = 0;
  }
  else {
    pos = (pcVar1->super_buffer)._used >> 5;
  }
  piVar4 = unique_array<mpt::item<mpt::layout::graph>_>::insert
                     (&this->super_unique_array<mpt::item<mpt::layout::graph>_>,pos);
  if (piVar4 == (item<mpt::layout::graph> *)0x0) {
LAB_00139d09:
    piVar4 = (item<mpt::layout::graph> *)0x0;
  }
  else {
    if (id != (char *)0x0) {
      bVar3 = identifier::set_name(&piVar4->super_identifier,id,len);
      if (!bVar3) {
        unique_array<mpt::item<mpt::layout::graph>_>::resize
                  (&this->super_unique_array<mpt::item<mpt::layout::graph>_>,pos);
        goto LAB_00139d09;
      }
    }
    pgVar2 = (piVar4->super_reference<mpt::layout::graph>)._ref;
    if (pgVar2 != (graph *)0x0) {
      (*(pgVar2->super_item_group).super_metatype.super_convertable._vptr_convertable[1])();
    }
    (piVar4->super_reference<mpt::layout::graph>)._ref = t;
  }
  return piVar4;
}

Assistant:

item<T> *append(T *t, const char *id, int len = -1)
	{
		item<T> *it;
		long pos = this->length();
		if (!(it = this->insert(pos))) {
			return 0;
		}
		if (!id || it->identifier::set_name(id, len)) {
			it->set_instance(t);
			return it;
		}
		this->resize(pos);
		return 0;
	}